

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_formats.c
# Opt level: O0

long FMget_array_element_count(FMFormat_conflict f,FMVarInfoList var,char *data,int encode)

{
  int iVar1;
  size_t sVar2;
  long in_RSI;
  long in_RDI;
  _FMgetFieldStruct tmp_src_spec;
  int field;
  size_t tmp;
  size_t count;
  int i;
  void *in_stack_ffffffffffffffa8;
  long local_28;
  int local_20;
  
  local_28 = 1;
  for (local_20 = 0; local_20 < *(int *)(in_RSI + 0x10); local_20 = local_20 + 1) {
    if (*(int *)(*(long *)(in_RSI + 0x18) + (long)local_20 * 8) == 0) {
      iVar1 = *(int *)(*(long *)(in_RSI + 0x18) + 4 + (long)local_20 * 8);
      memset(&stack0xffffffffffffffb0,0,0x18);
      sVar2 = get_FMlong((FMFieldPtr)
                         (long)*(int *)(*(long *)(in_RDI + 0x78) + (long)iVar1 * 0x18 + 0x14),
                         in_stack_ffffffffffffffa8);
    }
    else {
      sVar2 = (size_t)*(int *)(*(long *)(in_RSI + 0x18) + (long)local_20 * 8);
    }
    local_28 = local_28 * sVar2;
  }
  return local_28;
}

Assistant:

extern long
FMget_array_element_count(FMFormat f, FMVarInfoList var, char *data, int encode)
{
    int i;
    size_t count = 1;
    size_t tmp;
    for (i = 0; i < var->dimen_count; i++) {
	if (var->dimens[i].static_size != 0) {
	    count = count * var->dimens[i].static_size;
	} else {
	    int field = var->dimens[i].control_field_index;
	    struct _FMgetFieldStruct tmp_src_spec;
	    memset(&tmp_src_spec, 0, sizeof(tmp_src_spec));
	    tmp_src_spec.size = f->field_list[field].field_size;
	    tmp_src_spec.offset = f->field_list[field].field_offset;
	    tmp_src_spec.data_type = integer_type;
	    tmp_src_spec.byte_swap = f->byte_reversal;
	    if (!encode) {
		tmp_src_spec.byte_swap = 0;
		tmp_src_spec.src_float_format = tmp_src_spec.target_float_format;
	    }
	    tmp = get_FMlong(&tmp_src_spec, data);
	    count = count * tmp;
	}
    }
    return (long) count;
}